

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O3

void multiple_args(void)

{
  r[0].type = 'i';
  l[0].type = 'i';
  r[0].val.i = 0x2a;
  l[0].val.i = 0x2a;
  r[1].type = 'T';
  l[1].type = 'T';
  r[1].val.T = 1;
  l[1].val.T = 1;
  r[2].type = 's';
  l[2].type = 's';
  l[2].val.d = (long)"multiple args 1" + 0xe;
  r[2].val.d = (long)"-1.0" + 3;
  cmp_gt(l,r,3,3,(rtosc_cmp_options *)0x0,"multiple args 1","multiple args 2",0x17a);
  r[0].type = 't';
  l[0].type = 't';
  r[0].val.d = 4.94065645841247e-324;
  l[0].val.d = 4.94065645841247e-324;
  l[1].type = 'f';
  r[1].type = 'd';
  l[1].val.i = 0x3f800000;
  r[1].val.h = 0x3ff0000000000000;
  cmp_gt(l,r,2,2,(rtosc_cmp_options *)0x0,"multiple args 3","multiple args 4",0x183);
  return;
}

Assistant:

void multiple_args()
{
    l[0].type = r[0].type = 'i';
    l[0].val.i = r[0].val.i = 42;
    l[1].type = r[1].type = 'T';
    l[1].val.T = r[1].val.T = 1;
    l[2].type = r[2].type = 's';
    l[2].val.s = "1";
    r[2].val.s = "0"; //different values

    cmp_gt(l, r, 3, 3, NULL, "multiple args 1", "multiple args 2", __LINE__);

    l[0].type = r[0].type = 't';
    l[0].val.t = r[0].val.t = 1;
    l[1].type = 'f';
    r[1].type = 'd';  //different types
    l[1].val.f = 1.0f;
    r[1].val.d = 1.0;

    cmp_gt(l, r, 2, 2, NULL, "multiple args 3", "multiple args 4", __LINE__);
}